

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::TrackEvent::ParseFromArray(TrackEvent *this,void *raw,size_t size)

{
  uint uVar1;
  byte *pbVar2;
  bool bVar3;
  uint16_t uVar4;
  unsigned_short uVar5;
  reference val;
  reference val_00;
  reference pvVar6;
  reference val_01;
  reference pvVar7;
  TaskExecution *pTVar8;
  LogMessage *pLVar9;
  ChromeCompositorSchedulerState *pCVar10;
  ChromeUserEvent *pCVar11;
  ChromeKeyedService *pCVar12;
  ChromeLegacyIpc *pCVar13;
  ChromeHistogramSample *pCVar14;
  ChromeLatencyInfo *pCVar15;
  ChromeFrameReporter *pCVar16;
  ChromeApplicationStateInfo *pCVar17;
  ChromeRendererSchedulerState *pCVar18;
  ChromeWindowHandleEventInfo *pCVar19;
  ChromeContentSettingsEventInfo *pCVar20;
  uint8_t *puVar21;
  SourceLocation *pSVar22;
  ChromeMessagePump *pCVar23;
  ChromeMojoEventInfo *pCVar24;
  TrackEvent_LegacyEvent *pTVar25;
  size_t sVar26;
  undefined4 local_210;
  undefined2 uStack_20c;
  undefined1 uStack_20a;
  undefined4 local_1f0;
  undefined2 uStack_1ec;
  undefined1 uStack_1ea;
  undefined1 local_1e8 [8];
  Field field;
  ProtoDecoder dec;
  bool packed_error;
  size_t size_local;
  void *raw_local;
  TrackEvent *this_local;
  ParseFieldResult res_3;
  ParseFieldResult res_2;
  uint32_t local_140;
  undefined4 uStack_13c;
  ParseFieldResult res_1;
  ParseFieldResult res;
  ulong local_e8;
  uint8_t *local_e0;
  uintptr_t payload_start;
  uint64_t payload_length;
  uint64_t size_1;
  uint64_t int_value;
  uint8_t *new_pos;
  uint8_t field_type;
  uint8_t *puStack_b0;
  uint32_t field_id;
  uint8_t *next;
  uint64_t preamble;
  uint8_t *pos;
  uint64_t kFieldTypeMask;
  byte *pbStack_88;
  uint8_t kFieldTypeNumBits;
  byte *local_80;
  ulong local_78;
  uint8_t *local_70;
  uintptr_t payload_start_1;
  uint64_t payload_length_1;
  uint64_t size_2;
  uint64_t int_value_1;
  uint8_t *new_pos_1;
  uint8_t field_type_1;
  uint8_t *puStack_40;
  uint32_t field_id_1;
  uint8_t *next_1;
  uint64_t preamble_1;
  uint8_t *pos_1;
  uint64_t kFieldTypeMask_1;
  byte *pbStack_18;
  uint8_t kFieldTypeNumBits_1;
  byte *local_10;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->category_iids_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->categories_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->extra_counter_track_uuids_);
  std::vector<long,_std::allocator<long>_>::clear(&this->extra_counter_values_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->extra_double_counter_track_uuids_);
  std::vector<double,_std::allocator<double>_>::clear(&this->extra_double_counter_values_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->flow_ids_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->terminating_flow_ids_);
  std::
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ::clear(&this->debug_annotations_);
  ::std::__cxx11::string::clear();
  protozero::ProtoDecoder::ProtoDecoder((ProtoDecoder *)&field.size_,raw,size);
  do {
    res_1._0_8_ = dec.end_;
    pbStack_88 = dec.begin_;
    local_140 = 0;
    local_80 = (byte *)res_1._0_8_;
    memset(&res_1.next,0,0x10);
    kFieldTypeMask._7_1_ = 3;
    pos = (uint8_t *)0x7;
    preamble = (uint64_t)local_80;
    if (local_80 < pbStack_88) {
      next = (uint8_t *)0x0;
      if (*local_80 < 0x80) {
        next = (uint8_t *)(ulong)*local_80;
        pbVar2 = local_80 + 1;
      }
      else {
        puStack_b0 = protozero::proto_utils::ParseVarInt(local_80,pbStack_88,(uint64_t *)&next);
        pbVar2 = puStack_b0;
        if ((uint8_t *)preamble == puStack_b0) goto LAB_0064e6f0;
      }
      preamble = (uint64_t)pbVar2;
      new_pos._4_4_ = (uint)((ulong)next >> 3);
      if ((new_pos._4_4_ != 0) && (preamble < pbStack_88)) {
        new_pos._3_1_ = (byte)next & 7;
        int_value = preamble;
        size_1 = 0;
        payload_length = 0;
        switch(new_pos._3_1_) {
        case 0:
          int_value = (uint64_t)
                      protozero::proto_utils::ParseVarInt((uint8_t *)preamble,pbStack_88,&size_1);
          if (int_value != preamble) {
LAB_0064e60c:
            uVar1 = new_pos._4_4_;
            res_1._0_8_ = int_value;
            uVar5 = std::numeric_limits<unsigned_short>::max();
            if (uVar5 < uVar1) {
              perfetto::base::ignore_result<char[42],unsigned_int>
                        ((char (*) [42])"Skipping field %u because its id > 0xFFFF",
                         (uint *)((long)&new_pos + 4));
              local_140 = 1;
            }
            else if (payload_length < 0x10000000) {
              local_140 = 2;
              protozero::Field::initialize
                        ((Field *)&res_1.next,(uint16_t)new_pos._4_4_,new_pos._3_1_,size_1,
                         (uint32_t)payload_length);
            }
            else {
              local_e8 = payload_length >> 10;
              perfetto::base::ignore_result<char[48],unsigned_int,unsigned_long>
                        ((char (*) [48])"Skipping field %u because it\'s too big (%lu KB)",
                         (uint *)((long)&new_pos + 4),&local_e8);
              local_140 = 1;
            }
          }
          break;
        case 1:
          int_value = preamble + 8;
          if (int_value <= pbStack_88) {
            size_1 = *(uint64_t *)preamble;
            goto LAB_0064e60c;
          }
          break;
        case 2:
          int_value = (uint64_t)
                      protozero::proto_utils::ParseVarInt
                                ((uint8_t *)preamble,pbStack_88,&payload_start);
          if ((int_value != preamble) && (payload_start <= (long)pbStack_88 - int_value)) {
            payload_length = payload_start;
            local_e0 = (uint8_t *)int_value;
            size_1 = int_value;
            int_value = (uint64_t)(int_value + payload_start);
            goto LAB_0064e60c;
          }
          break;
        default:
          perfetto::base::ignore_result<char[29],unsigned_char>
                    ((char (*) [29])"Invalid proto field type: %u",(uchar *)((long)&new_pos + 3));
          break;
        case 5:
          int_value = preamble + 4;
          if (int_value <= pbStack_88) {
            size_1 = (uint64_t)*(uint *)preamble;
            goto LAB_0064e60c;
          }
        }
      }
    }
LAB_0064e6f0:
    res_1.field._12_4_ = uStack_13c;
    res_1.field.size_ = local_140;
    dec.end_ = (uint8_t *)res_1._0_8_;
    if (local_140 != 1) {
      local_1e8 = (undefined1  [8])res_1.next;
      local_1f0 = (undefined4)res_1.field.int_value_;
      field.int_value_._0_4_ = local_1f0;
      uStack_1ec = (undefined2)(res_1.field.int_value_ >> 0x20);
      field.int_value_._4_2_ = uStack_1ec;
      uStack_1ea = (undefined1)(res_1.field.int_value_ >> 0x30);
      field.int_value_._6_1_ = uStack_1ea;
      do {
        bVar3 = protozero::Field::valid((Field *)local_1e8);
        if (!bVar3) {
          sVar26 = protozero::ProtoDecoder::bytes_left((ProtoDecoder *)&field.size_);
          return (bool)((sVar26 != 0 ^ 0xffU) & 1);
        }
        uVar4 = protozero::Field::id((Field *)local_1e8);
        sVar26 = std::bitset<47UL>::size(&this->_has_field_);
        if (uVar4 < sVar26) {
          uVar4 = protozero::Field::id((Field *)local_1e8);
          std::bitset<47UL>::set(&this->_has_field_,(ulong)uVar4,true);
        }
        uVar4 = protozero::Field::id((Field *)local_1e8);
        switch(uVar4) {
        case 1:
          protozero::Field::get((Field *)local_1e8,&this->timestamp_delta_us_);
          break;
        case 2:
          protozero::Field::get((Field *)local_1e8,&this->thread_time_delta_us_);
          break;
        case 3:
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<>
                    (&this->category_iids_);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             (&this->category_iids_);
          protozero::Field::get((Field *)local_1e8,pvVar6);
          break;
        case 4:
          std::
          vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
          ::emplace_back<>(&this->debug_annotations_);
          pvVar7 = std::
                   vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
                   ::back(&this->debug_annotations_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pvVar7->super_CppMessageObj)._vptr_CppMessageObj[4])(pvVar7,puVar21,sVar26);
          break;
        case 5:
          pTVar8 = protozero::CopyablePtr<perfetto::protos::gen::TaskExecution>::operator*
                             (&this->task_execution_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pTVar8->super_CppMessageObj)._vptr_CppMessageObj[4])(pTVar8,puVar21,sVar26);
          break;
        case 6:
          pTVar25 = protozero::CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent>::operator*
                              (&this->legacy_event_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pTVar25->super_CppMessageObj)._vptr_CppMessageObj[4])(pTVar25,puVar21,sVar26);
          break;
        default:
          protozero::Field::SerializeAndAppendTo((Field *)local_1e8,&this->unknown_fields_);
          break;
        case 8:
          protozero::Field::get((Field *)local_1e8,&this->thread_instruction_count_delta_);
          break;
        case 9:
          protozero::Field::
          get<perfetto::protos::gen::TrackEvent_Type,perfetto::protos::gen::TrackEvent_Type>
                    ((Field *)local_1e8,&this->type_);
          break;
        case 10:
          protozero::Field::get((Field *)local_1e8,&this->name_iid_);
          break;
        case 0xb:
          protozero::Field::get((Field *)local_1e8,&this->track_uuid_);
          break;
        case 0xc:
          std::vector<long,_std::allocator<long>_>::emplace_back<>(&this->extra_counter_values_);
          val_00 = std::vector<long,_std::allocator<long>_>::back(&this->extra_counter_values_);
          protozero::Field::get((Field *)local_1e8,val_00);
          break;
        case 0x10:
          protozero::Field::get((Field *)local_1e8,&this->timestamp_absolute_us_);
          break;
        case 0x11:
          protozero::Field::get((Field *)local_1e8,&this->thread_time_absolute_us_);
          break;
        case 0x14:
          protozero::Field::get((Field *)local_1e8,&this->thread_instruction_count_absolute_);
          break;
        case 0x15:
          pLVar9 = protozero::CopyablePtr<perfetto::protos::gen::LogMessage>::operator*
                             (&this->log_message_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pLVar9->super_CppMessageObj)._vptr_CppMessageObj[4])(pLVar9,puVar21,sVar26);
          break;
        case 0x16:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&this->categories_);
          val = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::back(&this->categories_);
          protozero::Field::get((Field *)local_1e8,val);
          break;
        case 0x17:
          protozero::Field::get((Field *)local_1e8,&this->name_);
          break;
        case 0x18:
          pCVar10 = protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorSchedulerState>::
                    operator*(&this->cc_scheduler_state_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar10->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar10,puVar21,sVar26);
          break;
        case 0x19:
          pCVar11 = protozero::CopyablePtr<perfetto::protos::gen::ChromeUserEvent>::operator*
                              (&this->chrome_user_event_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar11->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar11,puVar21,sVar26);
          break;
        case 0x1a:
          pCVar12 = protozero::CopyablePtr<perfetto::protos::gen::ChromeKeyedService>::operator*
                              (&this->chrome_keyed_service_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar12->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar12,puVar21,sVar26);
          break;
        case 0x1b:
          pCVar13 = protozero::CopyablePtr<perfetto::protos::gen::ChromeLegacyIpc>::operator*
                              (&this->chrome_legacy_ipc_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar13->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar13,puVar21,sVar26);
          break;
        case 0x1c:
          pCVar14 = protozero::CopyablePtr<perfetto::protos::gen::ChromeHistogramSample>::operator*
                              (&this->chrome_histogram_sample_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar14->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar14,puVar21,sVar26);
          break;
        case 0x1d:
          pCVar15 = protozero::CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo>::operator*
                              (&this->chrome_latency_info_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar15->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar15,puVar21,sVar26);
          break;
        case 0x1e:
          protozero::Field::get((Field *)local_1e8,&this->counter_value_);
          break;
        case 0x1f:
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<>
                    (&this->extra_counter_track_uuids_);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             (&this->extra_counter_track_uuids_);
          protozero::Field::get((Field *)local_1e8,pvVar6);
          break;
        case 0x20:
          pCVar16 = protozero::CopyablePtr<perfetto::protos::gen::ChromeFrameReporter>::operator*
                              (&this->chrome_frame_reporter_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar16->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar16,puVar21,sVar26);
          break;
        case 0x21:
          pSVar22 = protozero::CopyablePtr<perfetto::protos::gen::SourceLocation>::operator*
                              (&this->source_location_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pSVar22->super_CppMessageObj)._vptr_CppMessageObj[4])(pSVar22,puVar21,sVar26);
          break;
        case 0x22:
          protozero::Field::get((Field *)local_1e8,&this->source_location_iid_);
          break;
        case 0x23:
          pCVar23 = protozero::CopyablePtr<perfetto::protos::gen::ChromeMessagePump>::operator*
                              (&this->chrome_message_pump_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar23->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar23,puVar21,sVar26);
          break;
        case 0x24:
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<>
                    (&this->flow_ids_);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             (&this->flow_ids_);
          protozero::Field::get((Field *)local_1e8,pvVar6);
          break;
        case 0x26:
          pCVar24 = protozero::CopyablePtr<perfetto::protos::gen::ChromeMojoEventInfo>::operator*
                              (&this->chrome_mojo_event_info_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar24->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar24,puVar21,sVar26);
          break;
        case 0x27:
          pCVar17 = protozero::CopyablePtr<perfetto::protos::gen::ChromeApplicationStateInfo>::
                    operator*(&this->chrome_application_state_info_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar17->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar17,puVar21,sVar26);
          break;
        case 0x28:
          pCVar18 = protozero::CopyablePtr<perfetto::protos::gen::ChromeRendererSchedulerState>::
                    operator*(&this->chrome_renderer_scheduler_state_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar18->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar18,puVar21,sVar26);
          break;
        case 0x29:
          pCVar19 = protozero::CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo>::
                    operator*(&this->chrome_window_handle_event_info_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar19->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar19,puVar21,sVar26);
          break;
        case 0x2a:
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<>
                    (&this->terminating_flow_ids_);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             (&this->terminating_flow_ids_);
          protozero::Field::get((Field *)local_1e8,pvVar6);
          break;
        case 0x2b:
          pCVar20 = protozero::CopyablePtr<perfetto::protos::gen::ChromeContentSettingsEventInfo>::
                    operator*(&this->chrome_content_settings_event_info_);
          puVar21 = protozero::Field::data((Field *)local_1e8);
          sVar26 = protozero::Field::size((Field *)local_1e8);
          (*(pCVar20->super_CppMessageObj)._vptr_CppMessageObj[4])(pCVar20,puVar21,sVar26);
          break;
        case 0x2c:
          protozero::Field::get((Field *)local_1e8,&this->double_counter_value_);
          break;
        case 0x2d:
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<>
                    (&this->extra_double_counter_track_uuids_);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             (&this->extra_double_counter_track_uuids_);
          protozero::Field::get((Field *)local_1e8,pvVar6);
          break;
        case 0x2e:
          std::vector<double,_std::allocator<double>_>::emplace_back<>
                    (&this->extra_double_counter_values_);
          val_01 = std::vector<double,_std::allocator<double>_>::back
                             (&this->extra_double_counter_values_);
          protozero::Field::get((Field *)local_1e8,val_01);
        }
        do {
          res_3._0_8_ = dec.end_;
          pbStack_18 = dec.begin_;
          this_local._0_4_ = 0;
          local_10 = (byte *)res_3._0_8_;
          memset(&res_3.next,0,0x10);
          kFieldTypeMask_1._7_1_ = 3;
          pos_1 = (uint8_t *)0x7;
          preamble_1 = (uint64_t)local_10;
          if (local_10 < pbStack_18) {
            next_1 = (uint8_t *)0x0;
            if (*local_10 < 0x80) {
              next_1 = (uint8_t *)(ulong)*local_10;
              pbVar2 = local_10 + 1;
            }
            else {
              puStack_40 = protozero::proto_utils::ParseVarInt
                                     (local_10,pbStack_18,(uint64_t *)&next_1);
              pbVar2 = puStack_40;
              if ((uint8_t *)preamble_1 == puStack_40) goto LAB_0064f4f4;
            }
            preamble_1 = (uint64_t)pbVar2;
            new_pos_1._4_4_ = (uint)((ulong)next_1 >> 3);
            if ((new_pos_1._4_4_ != 0) && (preamble_1 < pbStack_18)) {
              new_pos_1._3_1_ = (byte)next_1 & 7;
              int_value_1 = preamble_1;
              size_2 = 0;
              payload_length_1 = 0;
              switch(new_pos_1._3_1_) {
              case 0:
                int_value_1 = (uint64_t)
                              protozero::proto_utils::ParseVarInt
                                        ((uint8_t *)preamble_1,pbStack_18,&size_2);
                if (int_value_1 != preamble_1) {
LAB_0064f437:
                  uVar1 = new_pos_1._4_4_;
                  res_3._0_8_ = int_value_1;
                  uVar5 = std::numeric_limits<unsigned_short>::max();
                  if (uVar5 < uVar1) {
                    perfetto::base::ignore_result<char[42],unsigned_int>
                              ((char (*) [42])"Skipping field %u because its id > 0xFFFF",
                               (uint *)((long)&new_pos_1 + 4));
                    this_local._0_4_ = 1;
                  }
                  else if (payload_length_1 < 0x10000000) {
                    this_local._0_4_ = 2;
                    protozero::Field::initialize
                              ((Field *)&res_3.next,(uint16_t)new_pos_1._4_4_,new_pos_1._3_1_,size_2
                               ,(uint32_t)payload_length_1);
                  }
                  else {
                    local_78 = payload_length_1 >> 10;
                    perfetto::base::ignore_result<char[48],unsigned_int,unsigned_long>
                              ((char (*) [48])"Skipping field %u because it\'s too big (%lu KB)",
                               (uint *)((long)&new_pos_1 + 4),&local_78);
                    this_local._0_4_ = 1;
                  }
                }
                break;
              case 1:
                int_value_1 = preamble_1 + 8;
                if (int_value_1 <= pbStack_18) {
                  size_2 = *(uint64_t *)preamble_1;
                  goto LAB_0064f437;
                }
                break;
              case 2:
                int_value_1 = (uint64_t)
                              protozero::proto_utils::ParseVarInt
                                        ((uint8_t *)preamble_1,pbStack_18,&payload_start_1);
                if ((int_value_1 != preamble_1) &&
                   (payload_start_1 <= (long)pbStack_18 - int_value_1)) {
                  payload_length_1 = payload_start_1;
                  local_70 = (uint8_t *)int_value_1;
                  size_2 = int_value_1;
                  int_value_1 = (uint64_t)(int_value_1 + payload_start_1);
                  goto LAB_0064f437;
                }
                break;
              default:
                perfetto::base::ignore_result<char[29],unsigned_char>
                          ((char (*) [29])"Invalid proto field type: %u",
                           (uchar *)((long)&new_pos_1 + 3));
                break;
              case 5:
                int_value_1 = preamble_1 + 4;
                if (int_value_1 <= pbStack_18) {
                  size_2 = (uint64_t)*(uint *)preamble_1;
                  goto LAB_0064f437;
                }
              }
            }
          }
LAB_0064f4f4:
          res_3.field._12_4_ = this_local._4_4_;
          res_3.field.size_ = (uint32_t)this_local;
          dec.end_ = (uint8_t *)res_3._0_8_;
        } while ((uint32_t)this_local == 1);
        local_210 = (undefined4)res_3.field.int_value_;
        uStack_20c = (undefined2)(res_3.field.int_value_ >> 0x20);
        uStack_20a = (undefined1)(res_3.field.int_value_ >> 0x30);
        local_1e8 = (undefined1  [8])res_3.next;
        field.int_value_._0_4_ = local_210;
        field.int_value_._4_2_ = uStack_20c;
        field.int_value_._6_1_ = uStack_20a;
      } while( true );
    }
  } while( true );
}

Assistant:

bool TrackEvent::ParseFromArray(const void* raw, size_t size) {
  category_iids_.clear();
  categories_.clear();
  extra_counter_track_uuids_.clear();
  extra_counter_values_.clear();
  extra_double_counter_track_uuids_.clear();
  extra_double_counter_values_.clear();
  flow_ids_.clear();
  terminating_flow_ids_.clear();
  debug_annotations_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 3 /* category_iids */:
        category_iids_.emplace_back();
        field.get(&category_iids_.back());
        break;
      case 22 /* categories */:
        categories_.emplace_back();
        field.get(&categories_.back());
        break;
      case 10 /* name_iid */:
        field.get(&name_iid_);
        break;
      case 23 /* name */:
        field.get(&name_);
        break;
      case 9 /* type */:
        field.get(&type_);
        break;
      case 11 /* track_uuid */:
        field.get(&track_uuid_);
        break;
      case 30 /* counter_value */:
        field.get(&counter_value_);
        break;
      case 44 /* double_counter_value */:
        field.get(&double_counter_value_);
        break;
      case 31 /* extra_counter_track_uuids */:
        extra_counter_track_uuids_.emplace_back();
        field.get(&extra_counter_track_uuids_.back());
        break;
      case 12 /* extra_counter_values */:
        extra_counter_values_.emplace_back();
        field.get(&extra_counter_values_.back());
        break;
      case 45 /* extra_double_counter_track_uuids */:
        extra_double_counter_track_uuids_.emplace_back();
        field.get(&extra_double_counter_track_uuids_.back());
        break;
      case 46 /* extra_double_counter_values */:
        extra_double_counter_values_.emplace_back();
        field.get(&extra_double_counter_values_.back());
        break;
      case 36 /* flow_ids */:
        flow_ids_.emplace_back();
        field.get(&flow_ids_.back());
        break;
      case 42 /* terminating_flow_ids */:
        terminating_flow_ids_.emplace_back();
        field.get(&terminating_flow_ids_.back());
        break;
      case 4 /* debug_annotations */:
        debug_annotations_.emplace_back();
        debug_annotations_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* task_execution */:
        (*task_execution_).ParseFromArray(field.data(), field.size());
        break;
      case 21 /* log_message */:
        (*log_message_).ParseFromArray(field.data(), field.size());
        break;
      case 24 /* cc_scheduler_state */:
        (*cc_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 25 /* chrome_user_event */:
        (*chrome_user_event_).ParseFromArray(field.data(), field.size());
        break;
      case 26 /* chrome_keyed_service */:
        (*chrome_keyed_service_).ParseFromArray(field.data(), field.size());
        break;
      case 27 /* chrome_legacy_ipc */:
        (*chrome_legacy_ipc_).ParseFromArray(field.data(), field.size());
        break;
      case 28 /* chrome_histogram_sample */:
        (*chrome_histogram_sample_).ParseFromArray(field.data(), field.size());
        break;
      case 29 /* chrome_latency_info */:
        (*chrome_latency_info_).ParseFromArray(field.data(), field.size());
        break;
      case 32 /* chrome_frame_reporter */:
        (*chrome_frame_reporter_).ParseFromArray(field.data(), field.size());
        break;
      case 39 /* chrome_application_state_info */:
        (*chrome_application_state_info_).ParseFromArray(field.data(), field.size());
        break;
      case 40 /* chrome_renderer_scheduler_state */:
        (*chrome_renderer_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 41 /* chrome_window_handle_event_info */:
        (*chrome_window_handle_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 43 /* chrome_content_settings_event_info */:
        (*chrome_content_settings_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 33 /* source_location */:
        (*source_location_).ParseFromArray(field.data(), field.size());
        break;
      case 34 /* source_location_iid */:
        field.get(&source_location_iid_);
        break;
      case 35 /* chrome_message_pump */:
        (*chrome_message_pump_).ParseFromArray(field.data(), field.size());
        break;
      case 38 /* chrome_mojo_event_info */:
        (*chrome_mojo_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 1 /* timestamp_delta_us */:
        field.get(&timestamp_delta_us_);
        break;
      case 16 /* timestamp_absolute_us */:
        field.get(&timestamp_absolute_us_);
        break;
      case 2 /* thread_time_delta_us */:
        field.get(&thread_time_delta_us_);
        break;
      case 17 /* thread_time_absolute_us */:
        field.get(&thread_time_absolute_us_);
        break;
      case 8 /* thread_instruction_count_delta */:
        field.get(&thread_instruction_count_delta_);
        break;
      case 20 /* thread_instruction_count_absolute */:
        field.get(&thread_instruction_count_absolute_);
        break;
      case 6 /* legacy_event */:
        (*legacy_event_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}